

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O3

ThisType * Gs::Matrix<float,_3UL,_3UL>::Identity(void)

{
  undefined1 auVar1 [16];
  float *pfVar2;
  long lVar3;
  ThisType *result;
  ThisType *in_RDI;
  long lVar4;
  long lVar6;
  undefined1 auVar5 [16];
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  
  auVar5 = _DAT_0010d0a0;
  auVar1 = _DAT_0010d080;
  pfVar2 = in_RDI->m_ + 1;
  lVar3 = 0;
  do {
    lVar4 = 0;
    auVar9 = auVar5;
    do {
      auVar8 = auVar9 ^ auVar1;
      bVar7 = auVar8._4_4_ == -0x80000000 && auVar8._0_4_ < -0x7ffffffd;
      if (bVar7) {
        fVar10 = 1.0;
        if (lVar3 != lVar4) {
          fVar10 = 0.0;
        }
        pfVar2[lVar4 + -1] = fVar10;
      }
      if (bVar7) {
        fVar10 = 1.0;
        if (lVar3 + -1 != lVar4) {
          fVar10 = 0.0;
        }
        pfVar2[lVar4] = fVar10;
      }
      auVar8 = _DAT_0010d0a0;
      lVar4 = lVar4 + 2;
      lVar6 = auVar9._8_8_;
      auVar9._0_8_ = auVar9._0_8_ + 2;
      auVar9._8_8_ = lVar6 + 2;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 3;
  } while (lVar3 != 3);
  pfVar2 = in_RDI->m_ + 1;
  lVar3 = 0;
  do {
    lVar4 = 0;
    auVar5 = auVar8;
    do {
      auVar9 = auVar5 ^ auVar1;
      bVar7 = auVar9._4_4_ == -0x80000000 && auVar9._0_4_ < -0x7ffffffd;
      if (bVar7) {
        fVar10 = 1.0;
        if (lVar3 != lVar4) {
          fVar10 = 0.0;
        }
        pfVar2[lVar4 + -1] = fVar10;
      }
      if (bVar7) {
        fVar10 = 1.0;
        if (lVar3 + -1 != lVar4) {
          fVar10 = 0.0;
        }
        pfVar2[lVar4] = fVar10;
      }
      lVar4 = lVar4 + 2;
      lVar6 = auVar5._8_8_;
      auVar5._0_8_ = auVar5._0_8_ + 2;
      auVar5._8_8_ = lVar6 + 2;
    } while (lVar4 != 4);
    lVar3 = lVar3 + 1;
    pfVar2 = pfVar2 + 3;
  } while (lVar3 != 3);
  return in_RDI;
}

Assistant:

static ThisType Identity()
        {
            ThisType result;
            result.LoadIdentity();
            return result;
        }